

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplerBindingRenderCase::~SamplerBindingRenderCase
          (SamplerBindingRenderCase *this)

{
  SamplerBindingRenderCase *this_local;
  
  ~SamplerBindingRenderCase(this);
  operator_delete(this,0x120);
  return;
}

Assistant:

SamplerBindingRenderCase::~SamplerBindingRenderCase (void)
{
	deinit();
}